

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O2

void __thiscall trng::lcg64_shift::jump(lcg64_shift *this,unsigned_long_long s)

{
  result_type rVar1;
  result_type rVar2;
  uint i_1;
  uint uVar3;
  
  if (s < 0x10) {
    rVar1 = (this->P).b;
    rVar2 = (this->S).r;
    for (uVar3 = 0; uVar3 < (uint)s; uVar3 = uVar3 + 1) {
      rVar2 = rVar2 * (this->P).a + rVar1;
      (this->S).r = rVar2;
    }
  }
  else {
    uVar3 = 0;
    for (; s != 0; s = s >> 1) {
      if ((s & 1) != 0) {
        jump2(this,uVar3);
      }
      uVar3 = uVar3 + 1;
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void lcg64_shift::jump(unsigned long long s) {
    if (s < 16) {
      for (unsigned int i{0}; i < s; ++i)
        step();
    } else {
      unsigned int i{0};
      while (s > 0) {
        if (s % 2 == 1)
          jump2(i);
        ++i;
        s >>= 1u;
      }
    }
  }